

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O3

void __thiscall
tinyusdz::primvar::PrimVar::set_value<tinyusdz::value::quatf>(PrimVar *this,quatf *v)

{
  storage_union local_28;
  undefined1 *local_18;
  
  local_18 = linb::any::vtable_for_type<tinyusdz::value::quatf>()::table;
  local_28.dynamic = (void *)*(undefined8 *)(v->imag)._M_elems;
  local_28._8_8_ = *(undefined8 *)((v->imag)._M_elems + 2);
  linb::any::swap((any *)&local_28,(any *)this);
  if (local_18 != (undefined1 *)0x0) {
    (**(code **)(local_18 + 0x20))(&local_28);
  }
  return;
}

Assistant:

void set_value(const T &v) {
    _value = v;
  }